

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O1

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  uint uVar1;
  unsigned_long *puVar2;
  iterator __position;
  pointer puVar3;
  pointer pSVar4;
  long lVar5;
  long lVar6;
  iterator iVar7;
  undefined8 in_RAX;
  long lVar8;
  long lVar9;
  ulong __new_size;
  undefined8 local_28;
  
  puVar2 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar9 = (long)__position._M_current - (long)puVar2;
  if (lVar9 == 0) {
    uVar1 = (uint)(this->result_)._M_string_length;
    local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    local_28 = CONCAT44(local_28._4_4_,uVar1);
    iVar7._M_current =
         (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->filter_offsets_,iVar7,(uint *)&local_28);
    }
    else {
      *iVar7._M_current = uVar1;
      (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
  }
  else {
    __new_size = lVar9 >> 3;
    local_28 = (this->keys_)._M_string_length;
    if (__position._M_current ==
        (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->start_,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (&this->tmp_keys_,__new_size);
    if (__position._M_current != puVar2) {
      lVar9 = __new_size + (__new_size == 0);
      lVar8 = 0;
      do {
        puVar3 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar4 = (this->tmp_keys_).
                 super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = *(long *)(lVar8 + (long)puVar3);
        lVar6 = *(long *)(lVar8 + 8 + (long)puVar3);
        *(pointer *)((long)&pSVar4->data_ + lVar8 * 2) = (this->keys_)._M_dataplus._M_p + lVar5;
        *(long *)((long)&pSVar4->size_ + lVar8 * 2) = lVar6 - lVar5;
        lVar8 = lVar8 + 8;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    uVar1 = (uint)(this->result_)._M_string_length;
    local_28 = CONCAT44(local_28._4_4_,uVar1);
    iVar7._M_current =
         (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->filter_offsets_,iVar7,(uint *)&local_28);
    }
    else {
      *iVar7._M_current = uVar1;
      (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    (*this->policy_->_vptr_FilterPolicy[3])
              (this->policy_,
               (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
               ._M_impl.super__Vector_impl_data._M_start,__new_size & 0xffffffff,&this->result_);
    pSVar4 = (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar4) {
      (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar4;
    }
    (this->keys_)._M_string_length = 0;
    *(this->keys_)._M_dataplus._M_p = '\0';
    puVar3 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
  }
  return;
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back((uint32_t)result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back((uint32_t)result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}